

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O2

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::changeCol(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,int n,
           LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *newCol,bool scale)

{
  int *piVar1;
  Item *pIVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  byte bVar6;
  LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pLVar7;
  uint uVar8;
  int *piVar9;
  undefined7 in_register_00000009;
  long lVar10;
  long lVar11;
  Item *pIVar12;
  ulong uVar13;
  LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pLVar14;
  uint *puVar15;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar16;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  *pnVar17;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar18;
  soplex *psVar19;
  long lVar20;
  byte bVar21;
  int idx;
  int n_local;
  undefined4 local_1c4;
  LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_1c0;
  LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_1b8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  soplex local_130 [112];
  int local_c0;
  undefined1 local_bc;
  int local_b8;
  int local_b4;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  local_b0;
  
  bVar21 = 0;
  local_1c4 = (undefined4)CONCAT71(in_register_00000009,scale);
  if (-1 < n) {
    pIVar12 = (this->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.theitem;
    iVar3 = (this->
            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.thekey[(uint)n].idx;
    pIVar2 = pIVar12 + iVar3;
    uVar13 = (ulong)(uint)pIVar12[iVar3].data.
                          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .memused;
    lVar20 = uVar13 * 0x84 + -4;
    n_local = n;
    local_1c0 = newCol;
    for (; pLVar7 = local_1c0, 0 < (int)uVar13; uVar13 = (ulong)((int)uVar13 - 1)) {
      pIVar12 = (this->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.theitem +
                (this->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.thekey
                [*(int *)((long)(((pIVar2->data).
                                  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 .m_elem)->val).m_backend.data._M_elems + lVar20)].idx;
      uVar8 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::pos((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)pIVar12,n);
      if (-1 < (int)uVar8) {
        SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::remove((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)pIVar12,(char *)(ulong)uVar8);
      }
      lVar20 = lVar20 + -0x84;
    }
    (pIVar2->data).
    super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .memused = 0;
    lVar20 = 0x1c;
    pLVar14 = local_1c0;
    pnVar16 = &local_1b0;
    for (lVar10 = lVar20; lVar10 != 0; lVar10 = lVar10 + -1) {
      (pnVar16->m_backend).data._M_elems[0] = (pLVar14->up).m_backend.data._M_elems[0];
      pLVar14 = (LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)((long)pLVar14 + (ulong)bVar21 * -8 + 4);
      pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar16 + ((ulong)bVar21 * -2 + 1) * 4);
    }
    local_1b0.m_backend.exp = (local_1c0->up).m_backend.exp;
    local_1b0.m_backend.neg = (local_1c0->up).m_backend.neg;
    local_1b0.m_backend.fpclass = (local_1c0->up).m_backend.fpclass;
    local_1b0.m_backend.prec_elem = (local_1c0->up).m_backend.prec_elem;
    bVar6 = (byte)local_1c4;
    uVar13 = (ulong)(byte)local_1c4;
    (*(this->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x2d])(this,(ulong)(uint)n,&local_1b0,uVar13);
    pnVar16 = &pLVar7->low;
    pnVar18 = &local_1b0;
    for (lVar10 = lVar20; lVar10 != 0; lVar10 = lVar10 + -1) {
      (pnVar18->m_backend).data._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
      pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar16 + (ulong)bVar21 * -8 + 4);
      pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar18 + ((ulong)bVar21 * -2 + 1) * 4);
    }
    local_1b0.m_backend.exp = (pLVar7->low).m_backend.exp;
    local_1b0.m_backend.neg = (pLVar7->low).m_backend.neg;
    local_1b0.m_backend.fpclass = (pLVar7->low).m_backend.fpclass;
    local_1b0.m_backend.prec_elem = (pLVar7->low).m_backend.prec_elem;
    (*(this->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x2a])(this,(ulong)(uint)n,&local_1b0,(ulong)bVar6);
    pnVar16 = &pLVar7->object;
    pnVar18 = &local_1b0;
    for (; lVar20 != 0; lVar20 = lVar20 + -1) {
      (pnVar18->m_backend).data._M_elems[0] = (pnVar16->m_backend).data._M_elems[0];
      pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar16 + (ulong)bVar21 * -8 + 4);
      pnVar18 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar18 + ((ulong)bVar21 * -2 + 1) * 4);
    }
    local_1b0.m_backend.exp = (pLVar7->object).m_backend.exp;
    local_1b0.m_backend.neg = (pLVar7->object).m_backend.neg;
    local_1b0.m_backend.fpclass = (pLVar7->object).m_backend.fpclass;
    local_1b0.m_backend.prec_elem = (pLVar7->object).m_backend.prec_elem;
    (*(this->
      super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ).
      super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      .
      super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
      ._vptr_ClassArray[0x24])(this,(ulong)(uint)n,&local_1b0,uVar13);
    uVar13 = (ulong)(uint)(pLVar7->vec).
                          super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          .memused;
    local_1b8 = &this->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ;
    lVar20 = uVar13 * 0x84 + -4;
    for (; 0 < (int)uVar13; uVar13 = (ulong)((int)uVar13 - 1)) {
      piVar9 = (int *)((long)(((local_1c0->vec).
                               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              .m_elem)->val).m_backend.data._M_elems + lVar20);
      idx = *piVar9;
      lVar10 = 0x1c;
      puVar15 = (uint *)(piVar9 + -0x20);
      pnVar16 = &local_1b0;
      for (lVar11 = lVar10; lVar11 != 0; lVar11 = lVar11 + -1) {
        (pnVar16->m_backend).data._M_elems[0] = *puVar15;
        puVar15 = puVar15 + (ulong)bVar21 * -2 + 1;
        pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar16 + ((ulong)bVar21 * -2 + 1) * 4);
      }
      local_1b0.m_backend.exp = piVar9[-4];
      iVar5 = piVar9[-3];
      local_1b0.m_backend.neg = (bool)(char)iVar5;
      piVar1 = piVar9 + -2;
      iVar3 = *piVar1;
      iVar4 = piVar9[-1];
      local_1b0.m_backend.fpclass = piVar1[0];
      local_1b0.m_backend.prec_elem = piVar1[1];
      if ((byte)local_1c4 != '\0') {
        pnVar16 = &local_1b0;
        psVar19 = local_130;
        for (; lVar10 != 0; lVar10 = lVar10 + -1) {
          *(uint *)psVar19 = (pnVar16->m_backend).data._M_elems[0];
          pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar16 + ((ulong)bVar21 * -2 + 1) * 4);
          psVar19 = psVar19 + ((ulong)bVar21 * -2 + 1) * 4;
        }
        piVar9 = (this->
                 super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).scaleExp.data;
        local_c0 = local_1b0.m_backend.exp;
        local_bc = (char)iVar5;
        local_b8 = iVar3;
        local_b4 = iVar4;
        spxLdexp<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                  (&local_b0,local_130,
                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)(ulong)(uint)((this->
                                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                    ).scaleExp.data[idx] + piVar9[n_local]),(int)piVar9);
        pnVar17 = &local_b0;
        pnVar16 = &local_1b0;
        for (lVar10 = 0x1c; lVar10 != 0; lVar10 = lVar10 + -1) {
          (pnVar16->m_backend).data._M_elems[0] = (pnVar17->m_backend).data._M_elems[0];
          pnVar17 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                     *)((long)pnVar17 + ((ulong)bVar21 * -2 + 1) * 4);
          pnVar16 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar16 + ((ulong)bVar21 * -2 + 1) * 4);
        }
        local_1b0.m_backend.exp = local_b0.m_backend.exp;
        local_1b0.m_backend.neg = local_b0.m_backend.neg;
        local_1b0.m_backend.fpclass = local_b0.m_backend.fpclass;
        local_1b0.m_backend.prec_elem = local_b0.m_backend.prec_elem;
      }
      LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::add2(local_1b8,n_local,1,&idx,&local_1b0);
      LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::add2(&this->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ,idx,1,&n_local,&local_1b0);
      lVar20 = lVar20 + -0x84;
    }
  }
  return;
}

Assistant:

virtual void changeCol(int n, const LPColBase<R>& newCol, bool scale = false)
   {
      if(n < 0)
         return;

      int j;
      SVectorBase<R>& col = colVector_w(n);

      for(j = col.size() - 1; j >= 0; --j)
      {
         SVectorBase<R>& row = rowVector_w(col.index(j));
         int position = row.pos(n);

         assert(position != -1);

         if(position >= 0)
            row.remove(position);
      }

      col.clear();

      changeUpper(n, newCol.upper(), scale);
      changeLower(n, newCol.lower(), scale);
      changeObj(n, newCol.obj(), scale);

      const SVectorBase<R>& newcol = newCol.colVector();

      for(j = newcol.size() - 1; j >= 0; --j)
      {
         int idx = newcol.index(j);
         R val = newcol.value(j);

         if(scale)
            val = spxLdexp(val, LPColSetBase<R>::scaleExp[n] + LPRowSetBase<R>::scaleExp[idx]);

         LPColSetBase<R>::add2(n, 1, &idx, &val);
         LPRowSetBase<R>::add2(idx, 1, &n, &val);
      }

      assert(isConsistent());
   }